

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

RuleInfo * __thiscall
anon_unknown.dwarf_246d29::BuildEngineImpl::addRule
          (BuildEngineImpl *this,KeyID keyID,
          unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *rule)

{
  unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
  *this_00;
  __node_base *p_Var1;
  size_type *psVar2;
  Rule *pRVar3;
  ulong __c;
  _Hash_node_base _Var4;
  _Hash_node_base *p_Var5;
  BuildEngineDelegate *pBVar6;
  BuildDB *pBVar7;
  __node_ptr this_01;
  __node_ptr p_Var8;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var9;
  __node_ptr __bkt;
  size_type __n;
  ulong uVar10;
  ulong uVar11;
  __node_ptr __n_00;
  _Hash_node_base _Var12;
  RuleInfo *ruleInfo;
  undefined1 auVar13 [16];
  __buckets_alloc_type __alloc;
  string error;
  Twine local_48;
  
  this_00 = &this->ruleInfos;
  pRVar3 = (rule->_M_t).
           super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>.
           _M_t.
           super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
           super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
  (rule->_M_t).super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
  ._M_t.super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
  super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl = (Rule *)0x0;
  error.field_2._M_allocated_capacity = 0;
  error.field_2._8_8_ = 0;
  error._M_dataplus._M_p = (pointer)keyID._value;
  this_01 = (__node_ptr)operator_new(0xa8);
  (this_01->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  (this_01->
  super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
  ._M_storage._M_storage.__align = (anon_struct_8_0_00000001_for___align)keyID._value;
  *(ValueTy *)
   ((long)&(this_01->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 8) = keyID._value;
  *(Rule **)((long)&(this_01->
                    super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                    ._M_storage._M_storage + 0x10) = pRVar3;
  error._M_string_length = 0;
  *(undefined8 *)
   ((long)&(this_01->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x18) = 0;
  llbuild::core::Result::Result
            ((Result *)
             ((long)&(this_01->
                     super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                     ._M_storage._M_storage + 0x20),(Result *)((long)&error.field_2 + 8));
  (this_01->
  super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
  ._M_storage._M_storage.__data[0x94] = '\0';
  *(undefined4 *)
   ((long)&(this_01->
           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
           ._M_storage._M_storage + 0x90) = 0;
  __c = *(ulong *)&(this_01->
                   super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                   ._M_storage._M_storage;
  uVar11 = (this->ruleInfos)._M_h._M_bucket_count;
  __bkt = (__node_ptr)(__c % uVar11);
  __n_00 = __bkt;
  p_Var8 = std::
           _Hashtable<llbuild::core::KeyID,_std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::KeyID>,_std::hash<llbuild::core::KeyID>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,(size_type)__bkt,
                          (key_type *)
                          &this_01->
                           super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                          ,__c);
  if (p_Var8 == (__node_ptr)0x0) {
    auVar13 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->ruleInfos)._M_h._M_rehash_policy,uVar11,
                         (this->ruleInfos)._M_h._M_element_count);
    __n = auVar13._8_8_;
    if ((auVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = (this_00->_M_h)._M_buckets;
    }
    else {
      if (__n == 1) {
        __s = &(this->ruleInfos)._M_h._M_single_bucket;
        (this->ruleInfos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                        (&__alloc,__n);
        memset(__s,0,__n * 8);
      }
      p_Var1 = &(this->ruleInfos)._M_h._M_before_begin;
      _Var4._M_nxt = (this->ruleInfos)._M_h._M_before_begin._M_nxt;
      (this->ruleInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      uVar11 = 0;
LAB_00150d6a:
      _Var12._M_nxt = _Var4._M_nxt;
      uVar10 = uVar11;
      if (_Var12._M_nxt != (_Hash_node_base *)0x0) {
        _Var4._M_nxt = (_Var12._M_nxt)->_M_nxt;
        uVar11 = (ulong)_Var12._M_nxt[0x14]._M_nxt % __n;
        if (__s[uVar11] == (_Hash_node_base *)0x0) goto LAB_00150d9e;
        (_Var12._M_nxt)->_M_nxt = __s[uVar11]->_M_nxt;
        pp_Var9 = &__s[uVar11]->_M_nxt;
        uVar11 = uVar10;
        goto LAB_00150dbd;
      }
      std::
      _Hashtable<llbuild::core::KeyID,_std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::KeyID>,_std::hash<llbuild::core::KeyID>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_deallocate_buckets(&this_00->_M_h);
      (this->ruleInfos)._M_h._M_bucket_count = __n;
      (this->ruleInfos)._M_h._M_buckets = __s;
      __bkt = (__node_ptr)(__c % __n);
    }
    (this_01->
    super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
    ).super__Hash_node_code_cache<true>._M_hash_code = __c;
    if (__s[(long)__bkt] == (_Hash_node_base *)0x0) {
      p_Var5 = (this->ruleInfos)._M_h._M_before_begin._M_nxt;
      (this_01->super__Hash_node_base)._M_nxt = p_Var5;
      (this->ruleInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)this_01;
      if (p_Var5 != (_Hash_node_base *)0x0) {
        __s[(ulong)p_Var5[0x14]._M_nxt % (this->ruleInfos)._M_h._M_bucket_count] =
             (__node_base_ptr)this_01;
        __s = (this->ruleInfos)._M_h._M_buckets;
      }
      __s[(long)__bkt] = &(this->ruleInfos)._M_h._M_before_begin;
    }
    else {
      (this_01->super__Hash_node_base)._M_nxt = __s[(long)__bkt]->_M_nxt;
      __s[(long)__bkt]->_M_nxt = (_Hash_node_base *)this_01;
    }
    psVar2 = &(this->ruleInfos)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  else {
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
    ::_M_deallocate_node
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
                *)this_01,__n_00);
    this_01 = p_Var8;
  }
  RuleInfo::~RuleInfo((RuleInfo *)&error);
  if (p_Var8 == (__node_ptr)0x0) {
    pBVar7 = (this->db)._M_t.
             super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>
             .super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl;
    if (pBVar7 != (BuildDB *)0x0) {
      error._M_dataplus._M_p = (pointer)&error.field_2;
      error._M_string_length = 0;
      error.field_2._M_allocated_capacity = error.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      (*pBVar7->_vptr_BuildDB[5])
                (pBVar7,*(undefined8 *)
                         ((long)&(this_01->
                                 super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                                 ._M_storage._M_storage + 8),
                 *(long *)((long)&(this_01->
                                  super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                                  ._M_storage._M_storage + 0x10) + 8,
                 (undefined1 *)
                 ((long)&(this_01->
                         super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                         ._M_storage._M_storage + 0x20),&error);
      if (error._M_string_length != 0) {
        pBVar6 = this->delegate;
        llvm::Twine::Twine((Twine *)&__alloc,&error);
        (*pBVar6->_vptr_BuildEngineDelegate[7])(pBVar6,(Twine *)&__alloc);
        LOCK();
        (this->buildCancelled)._M_base._M_i = true;
        UNLOCK();
      }
      std::__cxx11::string::_M_dispose();
    }
  }
  else {
    pBVar6 = this->delegate;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__alloc,
                   "attempt to register duplicate rule \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)((long)&(this_01->
                                     super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                                     ._M_storage._M_storage + 0x10) + 8));
    std::operator+(&error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &__alloc,"\"\n");
    llvm::Twine::Twine(&local_48,&error);
    (*pBVar6->_vptr_BuildEngineDelegate[7])(pBVar6,&local_48);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    LOCK();
    (this->buildCancelled)._M_base._M_i = true;
    UNLOCK();
  }
  return (RuleInfo *)
         ((long)&(this_01->
                 super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                 ._M_storage._M_storage + 8);
LAB_00150d9e:
  (_Var12._M_nxt)->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = _Var12._M_nxt;
  __s[uVar11] = p_Var1;
  if ((_Var12._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var9 = __s + uVar10;
LAB_00150dbd:
    *pp_Var9 = _Var12._M_nxt;
  }
  goto LAB_00150d6a;
}

Assistant:

RuleInfo& addRule(KeyID keyID, std::unique_ptr<Rule>&& rule) {
    auto result = ruleInfos.emplace(keyID, RuleInfo(keyID, std::move(rule)));
    if (!result.second) {
      RuleInfo& ruleInfo = result.first->second;
      delegate.error("attempt to register duplicate rule \"" + ruleInfo.rule->key.str() + "\"\n");

      // Set cancelled, but return something 'valid' for use until it is
      // processed.
      buildCancelled = true;
      return ruleInfo;
    }

    // If we have a database attached, retrieve any stored result.
    //
    // FIXME: Investigate retrieving this result lazily. If the DB is
    // particularly efficient, it may be best to retrieve this only when we need
    // it and never duplicate it.
    RuleInfo& ruleInfo = result.first->second;
    if (db) {
      std::string error;
      db->lookupRuleResult(ruleInfo.keyID, *ruleInfo.rule, &ruleInfo.result, &error);
      if (!error.empty()) {
        // FIXME: Investigate changing the database error handling model to
        // allow builds to proceed without the database.
        delegate.error(error);
        buildCancelled = true;
      }
    }

    return ruleInfo;
  }